

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall args::PositionalBase::Validate(PositionalBase *this,string *param_1,string *param_2)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this_00;
  ostringstream problem;
  char *local_1b8;
  long local_1b0;
  char local_1a8 [16];
  ostringstream local_198 [376];
  
  if (((this->super_NamedBase).super_Base.options & Required) != None) {
    iVar1 = (*(this->super_NamedBase).super_Base._vptr_Base[2])();
    if ((char)iVar1 == '\0') {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Option \'",8);
      (*(this->super_NamedBase).super_Base._vptr_Base[0x12])(&local_1b8,this);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,local_1b8,local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' is required",0xd);
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,(string *)&local_1b8);
      *(undefined ***)this_00 = &PTR__runtime_error_0011d9d0;
      __cxa_throw(this_00,&RequiredError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

bool IsRequired() const noexcept
            {
                return (GetOptions() & Options::Required) != Options::None;
            }